

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O1

boolean passes_bars(permonst *mptr)

{
  char cVar1;
  ulong uVar2;
  
  if ((((mptr->mflags1 & 0xc) == 0) && (mptr != mons + 0x9f && mptr->mlet != '\x16')) &&
     (mptr->msize != 0)) {
    uVar2 = 0x10;
    do {
      cVar1 = *(char *)((long)mptr->mattk + (uVar2 - 0xf));
      if (0x23 < uVar2) break;
      uVar2 = uVar2 + 4;
    } while (cVar1 != '\x05');
    if (cVar1 != '\x05') {
      if ((mptr->mflags1 >> 0x13 & 1) == 0) {
        return '\0';
      }
      return mptr->msize < 3;
    }
  }
  return '\x01';
}

Assistant:

boolean passes_bars(const struct permonst *mptr)
{
    return (boolean) (passes_walls(mptr) || amorphous(mptr) ||
		      is_whirly(mptr) || verysmall(mptr) ||
		      dmgtype(mptr, AD_DISN) ||
		      (slithy(mptr) && !bigmonst(mptr)));
}